

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

Option * docopt::Option::parse(string *option_description)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  difference_type dVar4;
  char *in_RSI;
  Option *in_RDI;
  smatch match_1;
  string m;
  smatch *match;
  sregex_iterator e;
  sregex_iterator i;
  const_iterator options_end;
  size_type double_space;
  value val;
  int argcount;
  string longOption;
  string shortOption;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *in_stack_fffffffffffffc90;
  value *this;
  string *in_stack_fffffffffffffc98;
  value *other;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffca8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcb0;
  const_reference in_stack_fffffffffffffcc0;
  flag_type __f;
  const_reference in_stack_fffffffffffffcc8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffcd0;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *in_stack_fffffffffffffce8;
  regex_type *in_stack_fffffffffffffd08;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *in_stack_fffffffffffffd10;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd18;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd20;
  undefined1 local_2d0 [48];
  value *in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd6c;
  string *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  Option *in_stack_fffffffffffffd80;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  value_type *local_158;
  undefined4 local_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  char *local_100;
  undefined8 local_f8;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_f0;
  undefined8 local_b0;
  char *local_a8;
  char *local_a0;
  long local_98;
  int local_54;
  string local_50 [32];
  string local_30 [32];
  char *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  local_54 = 0;
  docopt::value::value((value *)in_stack_fffffffffffffc90,(bool)in_stack_fffffffffffffc8f);
  local_98 = std::__cxx11::string::find(local_10,0x30700d);
  local_a0 = (char *)std::__cxx11::string::end();
  if (local_98 != -1) {
    local_b0 = std::__cxx11::string::begin();
    local_a8 = (char *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)in_stack_fffffffffffffc98,
                                   (difference_type)in_stack_fffffffffffffc90);
    local_a0 = local_a8;
  }
  if ((parse(std::__cxx11::string_const&)::pattern_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&)::pattern_abi_cxx11_),
     iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
               (flag_type)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(std::__cxx11::string_const&)::pattern_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(std::__cxx11::string_const&)::pattern_abi_cxx11_);
  }
  local_f8 = std::__cxx11::string::begin();
  local_100 = local_a0;
  std::__cxx11::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_iterator(in_stack_fffffffffffffd10,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                   in_stack_fffffffffffffd08,(match_flag_type)((ulong)in_RDI >> 0x20));
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  std::__cxx11::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_iterator(in_stack_fffffffffffffc90);
  while( true ) {
    __f = (flag_type)((ulong)in_stack_fffffffffffffcc0 >> 0x20);
    bVar1 = std::__cxx11::
            regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
            ::operator!=(in_stack_fffffffffffffc90,
                         (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                          *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    if (!bVar1) break;
    local_158 = std::__cxx11::
                regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                ::operator*(&local_f0);
    pvVar3 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                          (size_type)in_stack_fffffffffffffc98);
    if ((pvVar3->matched & 1U) == 0) {
      in_stack_fffffffffffffcd0 =
           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
           std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                        (size_type)in_stack_fffffffffffffc98);
      dVar4 = std::__cxx11::
              sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::length((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffcb0._M_current);
      if (0 < dVar4) {
        in_stack_fffffffffffffcc8 =
             std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                          (size_type)in_stack_fffffffffffffc98);
        std::__cxx11::sub_match::operator_cast_to_string
                  ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
        local_54 = 1;
        std::__cxx11::string::~string(local_1f8);
      }
    }
    else {
      in_stack_fffffffffffffce8 =
           (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
            *)std::__cxx11::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                           (size_type)in_stack_fffffffffffffc98);
      dVar4 = std::__cxx11::
              sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::length((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffcb0._M_current);
      if (dVar4 == 1) {
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                     (size_type)in_stack_fffffffffffffc98);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str(in_stack_fffffffffffffcc8);
        std::operator+((char *)in_stack_fffffffffffffc98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc90);
        std::__cxx11::string::operator=(local_30,local_178);
        std::__cxx11::string::~string(local_178);
        std::__cxx11::string::~string(local_198);
      }
      else {
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                     (size_type)in_stack_fffffffffffffc98);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str(in_stack_fffffffffffffcc8);
        std::operator+((char *)in_stack_fffffffffffffc98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc90);
        std::__cxx11::string::operator=(local_50,local_1b8);
        std::__cxx11::string::~string(local_1b8);
        std::__cxx11::string::~string(local_1d8);
      }
    }
    in_stack_fffffffffffffcc0 =
         std::__cxx11::
         match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                      (size_type)in_stack_fffffffffffffc98);
    dVar4 = std::__cxx11::
            sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::length((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffcb0._M_current);
    __f = (flag_type)((ulong)in_stack_fffffffffffffcc0 >> 0x20);
    if (dVar4 == 0) break;
    std::__cxx11::
    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(in_stack_fffffffffffffce8);
  }
  local_14c = 2;
  std::__cxx11::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                     *)0x2b493f);
  std::__cxx11::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                     *)0x2b494c);
  if (local_54 != 0) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)in_stack_fffffffffffffc90);
    std::__cxx11::string::end();
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,__f);
    bVar1 = std::
            regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                       in_stack_fffffffffffffc98,
                       (match_flag_type)((ulong)in_stack_fffffffffffffc90 >> 0x20));
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffc90);
    if (bVar1) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   (size_type)in_stack_fffffffffffffc98);
      std::__cxx11::
      sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::str(in_stack_fffffffffffffcc8);
      docopt::value::value
                ((value *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc98);
      docopt::value::operator=
                ((value *)in_stack_fffffffffffffc90,
                 (value *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
      docopt::value::~value((value *)in_stack_fffffffffffffc90);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd70);
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)0x2b4af0);
  }
  this = (value *)(local_2d0 + 0x20);
  std::__cxx11::string::string((string *)this,local_30);
  other = (value *)local_2d0;
  std::__cxx11::string::string((string *)other,local_50);
  docopt::value::value((value *)CONCAT44(local_54,in_stack_fffffffffffffca0),other);
  Option(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
         in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60);
  docopt::value::~value(this);
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::~string((string *)(local_2d0 + 0x20));
  local_14c = 1;
  docopt::value::~value(this);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

Option Option::parse(std::string const& option_description)
{
	std::string shortOption, longOption;
	int argcount = 0;
	value val { false };
	
	auto double_space = option_description.find("  ");
	auto options_end = option_description.end();
	if (double_space != std::string::npos) {
		options_end = option_description.begin() + double_space;
	}
	
	static const std::regex pattern {"(--|-)?(.*?)([,= ]|$)"};
	for(std::sregex_iterator i {option_description.begin(), options_end, pattern, std::regex_constants::match_not_null},
	       e{};
	    i != e;
	    ++i)
	{
		std::smatch const& match = *i;
		if (match[1].matched) { // [1] is optional.
			if (match[1].length()==1) {
				shortOption = "-" + match[2].str();
			} else {
				longOption =  "--" + match[2].str();
			}
		} else if (match[2].length() > 0) { // [2] always matches.
			std::string m = match[2];
			argcount = 1;
		} else {
			// delimeter
		}

		if (match[3].length() == 0) { // [3] always matches.
			// Hit end of string. For some reason 'match_not_null' will let us match empty
			// at the end, and then we'll spin in an infinite loop. So, if we hit an empty
			// match, we know we must be at the end.
			break;
		}
	}

	if (argcount) {
		std::smatch match;
		if (std::regex_search(options_end, option_description.end(),
				      match,
				      std::regex{"\\[default: (.*)\\]", std::regex::icase}))
		{
			val = match[1].str();
		}
	}
	
	return {std::move(shortOption),
		std::move(longOption),
		argcount,
		std::move(val)};
}